

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirCSPECTMAP(void)

{
  bool bVar1;
  ulong uVar2;
  reference __source;
  CDevicePage *pCVar3;
  undefined1 local_30 [8];
  path fName;
  
  if ((pass == 3) && (DeviceID != (char *)0x0)) {
    GetOutputFileName_abi_cxx11_((path *)local_30,&lp);
    uVar2 = std::filesystem::__cxx11::path::has_filename();
    if ((uVar2 & 1) == 0) {
      bVar1 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!sourcePosStack.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/directives.cpp"
                      ,0x509,"void dirCSPECTMAP()");
      }
      __source = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
      std::filesystem::__cxx11::path::operator=
                ((path *)Options::CSpectMapFName_abi_cxx11_,&__source->filename);
      std::filesystem::__cxx11::path::operator+=((path *)Options::CSpectMapFName_abi_cxx11_,".map");
    }
    else {
      std::filesystem::__cxx11::path::operator=
                ((path *)Options::CSpectMapFName_abi_cxx11_,(path *)local_30);
    }
    pCVar3 = CDevice::GetPage(Device,0);
    Options::CSpectMapPageSize = pCVar3->Size;
    std::filesystem::__cxx11::path::~path((path *)local_30);
  }
  else {
    if (DeviceID == (char *)0x0) {
      Error("CSPECTMAP only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
    }
    SkipParam(&lp);
  }
  return;
}

Assistant:

static void dirCSPECTMAP() {
	if (LASTPASS != pass || !DeviceID) {
		if (!DeviceID) Error("CSPECTMAP only allowed in real device emulation mode (See DEVICE)");
		SkipParam(lp);
		return;
	}
	const std::filesystem::path fName = GetOutputFileName(lp);
	if (fName.has_filename()) {
		Options::CSpectMapFName = fName;
	} else {		// create default map file name from current source file name (appends ".map")
		assert(!sourcePosStack.empty());
		Options::CSpectMapFName = sourcePosStack.back().filename;
		Options::CSpectMapFName += ".map";
	}
	// remember page size of current device (in case the source is multi-device later)
	Options::CSpectMapPageSize = Device->GetPage(0)->Size;
}